

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O0

unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 __thiscall ninx::lexer::token::Text::get_identifier_abi_cxx11_(Text *this)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  Text *in_RSI;
  locale local_50 [8];
  undefined1 local_48 [8];
  string identifier;
  Text *this_local;
  
  if (get_identifier[abi:cxx11]()::identifierValidation == '\0') {
    iVar2 = __cxa_guard_acquire(&get_identifier[abi:cxx11]()::identifierValidation);
    if (iVar2 != 0) {
      boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
      basic_regex(&get_identifier::identifierValidation,"^\\s*[a-zA-Z][a-zA-Z0-9]*\\s*$",0);
      __cxa_atexit(boost::
                   basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
                   ~basic_regex,&get_identifier::identifierValidation,&__dso_handle);
      __cxa_guard_release(&get_identifier[abi:cxx11]()::identifierValidation);
    }
  }
  psVar3 = get_text_abi_cxx11_(in_RSI);
  bVar1 = boost::
          regex_match<std::char_traits<char>,std::allocator<char>,char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>
                    (psVar3,&get_identifier::identifierValidation,format_default);
  if (bVar1) {
    psVar3 = get_text_abi_cxx11_(in_RSI);
    std::__cxx11::string::string((string *)local_48,(string *)psVar3);
    std::locale::locale(local_50);
    boost::algorithm::trim<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
               local_50);
    std::locale::~locale(local_50);
    std::make_unique<std::__cxx11::string,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    std::__cxx11::string::~string((string *)local_48);
  }
  else {
    std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>::
    unique_ptr<std::default_delete<std::__cxx11::string>,void>
              ((unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>> *)this,
               (nullptr_t)0x0);
  }
  return (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<std::string> ninx::lexer::token::Text::get_identifier() {
    // Check if the text is alphanumeric, and do not contain spaces
    static const boost::regex identifierValidation("^\\s*[a-zA-Z][a-zA-Z0-9]*\\s*$");
    if (!regex_match(this->get_text(), identifierValidation)) {
        return nullptr;
    }

    // Trim the text to extract the identifier
    std::string identifier {this->get_text()};
    boost::algorithm::trim(identifier);

    return std::make_unique<std::string>(identifier);
}